

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O1

void __thiscall
Clasp::BasicProgramAdapter::minimize(BasicProgramAdapter *this,Weight_t prio,WeightLitSpan *lits)

{
  WeightLitVec *this_00;
  WeightLit_t *pWVar1;
  int iVar2;
  WeightLit_t *pWVar3;
  pair<Clasp::Literal,_int> local_30;
  
  if (prio == 0) {
    this_00 = &this->constraint_;
    (this->constraint_).ebo_.size = 0;
    if (lits->size != 0) {
      pWVar3 = lits->first;
      pWVar1 = pWVar3 + lits->size;
      do {
        iVar2 = pWVar3->lit;
        local_30.first.rep_ = iVar2 * -4 + 2;
        if (-1 < iVar2) {
          local_30.first.rep_ = iVar2 * 4;
        }
        local_30.second = pWVar3->weight;
        bk_lib::
        pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
        ::push_back(this_00,&local_30);
        pWVar3 = pWVar3 + 1;
      } while (pWVar3 != pWVar1);
    }
    iVar2 = (*this->prg_->_vptr_ProgramBuilder[8])();
    if (iVar2 == 0) {
      SatBuilder::addObjective((SatBuilder *)this->prg_,this_00);
    }
    else {
      PBBuilder::addObjective((PBBuilder *)this->prg_,this_00);
    }
    return;
  }
  Potassco::fail(-2,
                 "virtual void Clasp::BasicProgramAdapter::minimize(Potassco::Weight_t, const Potassco::WeightLitSpan &)"
                 ,0x18c,"prio == 0","unsupported rule type",0);
}

Assistant:

void BasicProgramAdapter::minimize(Potassco::Weight_t prio, const Potassco::WeightLitSpan& lits) {
	POTASSCO_REQUIRE(prio == 0, "unsupported rule type");
	using namespace Potassco;
	constraint_.clear();
	for (WeightLitSpan::iterator it = begin(lits), end = Potassco::end(lits); it != end; ++it) { constraint_.push_back(WeightLiteral(toLit(it->lit), it->weight)); }
	if (prg_->type() == Problem_t::Sat) {
		static_cast<SatBuilder&>(*prg_).addObjective(constraint_);
	}
	else {
		static_cast<PBBuilder&>(*prg_).addObjective(constraint_);
	}
}